

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64 *value)

{
  ulong *in_RSI;
  CodedInputStream *in_RDI;
  pair<unsigned_long,_bool> pVar1;
  pair<unsigned_long,_bool> p;
  bool local_1;
  
  if ((in_RDI->buffer_ < in_RDI->buffer_end_) && (*in_RDI->buffer_ < 0x80)) {
    *in_RSI = (ulong)*in_RDI->buffer_;
    Advance(in_RDI,1);
    local_1 = true;
  }
  else {
    pVar1 = ReadVarint64Fallback((CodedInputStream *)p.first);
    *in_RSI = pVar1.first;
    local_1 = (bool)(pVar1.second & 1);
  }
  return local_1;
}

Assistant:

inline bool CodedInputStream::ReadVarint64(uint64* value) {
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  }
  std::pair<uint64, bool> p = ReadVarint64Fallback();
  *value = p.first;
  return p.second;
}